

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:206:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:206:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  __normal_iterator<const_mjs::value_*,_std::vector<mjs::value,_std::allocator<mjs::value>_>_>
  __last;
  function_object *this_00;
  pointer pvVar1;
  vector<mjs::value,_std::allocator<mjs::value>_> new_args;
  
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __last._M_current =
       (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)__last._M_current - (long)pvVar1) / 0x28)) {
    std::vector<mjs::value,std::allocator<mjs::value>>::
    insert<__gnu_cxx::__normal_iterator<mjs::value_const*,std::vector<mjs::value,std::allocator<mjs::value>>>,void>
              ((vector<mjs::value,std::allocator<mjs::value>> *)&new_args,(const_iterator)0x0,
               pvVar1 + 1,__last);
  }
  this_00 = anon_unknown_65::get_function_object(this_);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar1 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar1 = (pointer)&value::undefined;
  }
  function_object::call(__return_storage_ptr__,this_00,pvVar1,&new_args);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&new_args);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }